

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void FreeTHREAD(CPalThread *pThread)

{
  CPalThread *pNext;
  CPalThread *pThread_local;
  
  (**pThread->_vptr_CPalThread)();
  memset(pThread,0xcc,0x708);
  CCLock::Enter(&free_threads_spinlock);
  pNext = Volatile::operator_cast_to_CPalThread_((Volatile *)&free_threads_list);
  CorUnix::CPalThread::SetNext(pThread,pNext);
  Volatile<CorUnix::CPalThread_*>::operator=(&free_threads_list,pThread);
  CCLock::Leave(&free_threads_spinlock);
  return;
}

Assistant:

static void FreeTHREAD(CPalThread *pThread)
{
    //
    // Run the destructors for this object
    //

    pThread->~CPalThread();

#ifdef _DEBUG
    // Fill value so we can find code re-using threads after they're dead. We
    // check against pThread->dwGuard when getting the current thread's data.
    memset((void*)pThread, 0xcc, sizeof(*pThread));
#endif

    // We SHOULD be doing the following, but it causes massive problems. See the
    // comment below.
    //pthread_setspecific(thObjKey, NULL); // Make sure any TLS entry is removed.

    //
    // Never actually free the THREAD structure to make the TLS lookaside cache work.
    // THREAD* for terminated thread can be stuck in the lookaside cache code for an
    // arbitrary amount of time. The unused THREAD* structures has to remain in a
    // valid memory and thus can't be returned to the heap.
    //
    // TODO: is this really true? Why would the entry remain in the cache for
    // an indefinite period of time after we've flushed it?
    //

    /* NOTE: can't use a CRITICAL_SECTION here: EnterCriticalSection(&cs,TRUE) and
       LeaveCriticalSection(&cs,TRUE) need to access the thread private data
       stored in the very THREAD structure that we just destroyed. Entering and
       leaving the critical section with internal==FALSE leads to possible hangs
       in the PROCSuspendOtherThreads logic, at shutdown time

       Update: [TODO] PROCSuspendOtherThreads has been removed. Can this
       code be changed?*/

    free_threads_spinlock.Enter();

    pThread->SetNext(free_threads_list);
    free_threads_list = pThread;

    free_threads_spinlock.Leave();
}